

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

RawBrandedSchema * __thiscall capnp::SchemaLoader::Impl::getUnbound(Impl *this,RawSchema *schema)

{
  Maybe<capnp::_::RawBrandedSchema_*&> MVar1;
  RawBrandedSchema *value;
  ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency> AVar2;
  RawSchema *local_68;
  Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> local_60;
  Reader local_48;
  
  local_68 = schema;
  readMessageUnchecked<capnp::schema::Node>(&local_48,schema->encodedNode);
  if ((local_48._reader.dataSize < 0x121) ||
     ((*(byte *)((long)local_48._reader.data + 0x24) & 1) == 0)) {
    value = &schema->defaultBrand;
  }
  else {
    MVar1 = kj::HashMap<capnp::_::RawSchema_const*,capnp::_::RawBrandedSchema*>::
            find<capnp::_::RawSchema_const*&>
                      ((HashMap<capnp::_::RawSchema_const*,capnp::_::RawBrandedSchema*> *)
                       &this->unboundBrands,&local_68);
    if (MVar1.ptr == (RawBrandedSchema **)0x0) {
      value = kj::Arena::allocate<capnp::_::RawBrandedSchema>(&this->arena);
      value->scopes = (Scope *)0x0;
      value->dependencies = (Dependency *)0x0;
      value->scopeCount = 0;
      value->dependencyCount = 0;
      value->lazyInitializer = (Initializer *)0x0;
      value->generic = local_68;
      local_60.ptr.isSet = false;
      AVar2 = makeBrandedDependencies(this,local_68,&local_60);
      value->dependencies = AVar2.ptr;
      value->dependencyCount = (uint32_t)AVar2.size_;
      kj::HashMap<const_capnp::_::RawSchema_*,_capnp::_::RawBrandedSchema_*>::insert
                (&this->unboundBrands,local_68,value);
    }
    else {
      value = *MVar1.ptr;
    }
  }
  return value;
}

Assistant:

const _::RawBrandedSchema* SchemaLoader::Impl::getUnbound(const _::RawSchema* schema) {
  if (!readMessageUnchecked<schema::Node>(schema->encodedNode).getIsGeneric()) {
    // Not a generic type, so just return the default brand.
    return &schema->defaultBrand;
  }

  KJ_IF_MAYBE(existing, unboundBrands.find(schema)) {
    return *existing;
  } else {
    auto slot = &arena.allocate<_::RawBrandedSchema>();
    memset(slot, 0, sizeof(*slot));
    slot->generic = schema;
    auto deps = makeBrandedDependencies(schema, nullptr);
    slot->dependencies = deps.begin();
    slot->dependencyCount = deps.size();
    unboundBrands.insert(schema, slot);
    return slot;
  }